

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this,TypeVector *expected)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  Result RVar4;
  Result RVar5;
  Result RVar6;
  ulong uVar7;
  Type TVar8;
  ulong uVar9;
  bool bVar10;
  Type type2;
  Type type1;
  
  type1.enum_ = Any;
  type1.type_index_ = 0;
  type2.enum_ = Any;
  type2.type_index_ = 0;
  RVar4 = PeekAndCheckType(this,0,(Type)0xffffffff);
  RVar5 = PeekType(this,1,&type1);
  RVar6 = PeekType(this,2,&type2);
  bVar3 = RVar6.enum_ == Error || (RVar5.enum_ == Error || RVar4.enum_ == Error);
  pTVar1 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar1 == pTVar2) {
    bVar10 = true;
    if (((7 < (uint)(type1.enum_ + 0x17)) || ((0xc5U >> (type1.enum_ + 0x17 & 0x1fU) & 1) == 0)) &&
       ((7 < (uint)(type2.enum_ + 0x17) || ((0xc5U >> (type2.enum_ + 0x17 & 0x1fU) & 1) == 0)))) {
      uVar9 = (ulong)type1 & 0xffffffff;
      bVar10 = bVar3 || type1 != type2 && (uVar9 != 0 && type2.enum_ != Any);
      uVar7 = (ulong)type1 & 0xffffffff00000000;
      goto LAB_0014d5e1;
    }
  }
  else {
    if ((long)pTVar2 - (long)pTVar1 != 8) {
      __assert_fail("expected.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/type-checker.cc"
                    ,0x362,"Result wabt::TypeChecker::OnSelect(const TypeVector &)");
    }
    TVar8 = *pTVar1;
    bVar10 = TVar8.enum_ != Any;
    bVar10 = type2 != TVar8 && (type2.enum_ != Any && bVar10) ||
             (bVar3 || type1 != TVar8 && (type1.enum_ != Any && bVar10));
  }
  uVar9 = 0;
  uVar7 = 0;
LAB_0014d5e1:
  TVar8 = (Type)(uVar9 | uVar7);
  RVar4.enum_._1_3_ = 0;
  RVar4.enum_._0_1_ = bVar10;
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>(this,RVar4,"select",TVar8,TVar8,I32);
  RVar4 = DropTypes(this,3);
  PushType(this,TVar8);
  return (Result)(uint)(byte)(bVar10 | RVar4.enum_ == Error);
}

Assistant:

Result TypeChecker::OnSelect(const TypeVector& expected) {
  Result result = Result::Ok;
  Type type1 = Type::Any;
  Type type2 = Type::Any;
  Type result_type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type1);
  result |= PeekType(2, &type2);
  if (expected.empty()) {
    if (type1.IsRef() || type2.IsRef()) {
      result = Result::Error;
    } else {
      result |= CheckType(type1, type2);
      result_type = type1;
    }
  } else {
    assert(expected.size() == 1);
    result |= CheckType(type1, expected[0]);
    result |= CheckType(type2, expected[0]);
  }
  PrintStackIfFailed(result, "select", result_type, result_type, Type::I32);
  result |= DropTypes(3);
  PushType(result_type);
  return result;
}